

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

int * parasail_result_get_score_col(parasail_result_t *result)

{
  char *pcVar1;
  char *__format;
  
  if (result == (parasail_result_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar1 = "result";
  }
  else {
    if ((~result->flag & 0x50000U) == 0) {
      return *(int **)((long)((result->field_4).trace)->trace_del_table + 0x20);
    }
    if (((uint)result->flag >> 0x12 & 1) != 0) {
      return ((result->field_4).rowcols)->score_col;
    }
    __format = "%s: assert(%s) failed\n";
    pcVar1 = "parasail_result_is_stats_rowcol(result) || parasail_result_is_rowcol(result)";
  }
  fprintf(_stderr,__format,"parasail_result_get_score_col",pcVar1);
  return (int *)0x0;
}

Assistant:

int* parasail_result_get_score_col(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_stats_rowcol(result) || parasail_result_is_rowcol(result));
    if (parasail_result_is_stats_rowcol(result)) {
        return result->stats->rowcols->score_col;
    }
    if (parasail_result_is_rowcol(result)) {
        return result->rowcols->score_col;
    }
    return NULL; /* should not reach */
}